

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O3

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_device_type_t val)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (val - ZE_DEVICE_TYPE_GPU < 4) {
    pcVar1 = &DAT_0010b250 + *(int *)(&DAT_0010b250 + (ulong)(val - ZE_DEVICE_TYPE_GPU) * 4);
  }
  else {
    pcVar1 = "?";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( const ze_device_type_t val )
{
    std::string str;

    switch( val )
    {
    case ZE_DEVICE_TYPE_GPU:
        str = "ZE_DEVICE_TYPE_GPU";
        break;

    case ZE_DEVICE_TYPE_CPU:
        str = "ZE_DEVICE_TYPE_CPU";
        break;

    case ZE_DEVICE_TYPE_FPGA:
        str = "ZE_DEVICE_TYPE_FPGA";
        break;

    case ZE_DEVICE_TYPE_MCA:
        str = "ZE_DEVICE_TYPE_MCA";
        break;

    default:
        str = "?";
        break;
    };

    return str;
}